

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O0

void xe::writeTestResult(TestCaseResult *result,Writer *xmlWriter)

{
  int iVar1;
  int iVar2;
  Writer *pWVar3;
  char *pcVar4;
  Item *item;
  Attribute local_170;
  BeginElement local_130;
  int local_10c;
  undefined1 local_108 [4];
  int ndx;
  Attribute local_c8;
  Attribute local_88;
  BeginElement local_38;
  Writer *local_18;
  Writer *xmlWriter_local;
  TestCaseResult *result_local;
  
  local_18 = xmlWriter;
  xmlWriter_local = (Writer *)result;
  xml::Writer::BeginElement::BeginElement(&local_38,"TestCaseResult");
  pWVar3 = xml::Writer::operator<<(xmlWriter,&local_38);
  xml::Writer::Attribute::Attribute(&local_88,"Version",TEST_LOG_VERSION);
  pWVar3 = xml::Writer::operator<<(pWVar3,&local_88);
  xml::Writer::Attribute::Attribute(&local_c8,"CasePath",(string *)xmlWriter_local);
  pWVar3 = xml::Writer::operator<<(pWVar3,&local_c8);
  pcVar4 = getTestCaseTypeName(*(TestCaseType *)&(xmlWriter_local->m_dataBuf).field_0x18);
  xml::Writer::Attribute::Attribute((Attribute *)local_108,"CaseType",pcVar4);
  xml::Writer::operator<<(pWVar3,(Attribute *)local_108);
  xml::Writer::Attribute::~Attribute((Attribute *)local_108);
  xml::Writer::Attribute::~Attribute(&local_c8);
  xml::Writer::Attribute::~Attribute(&local_88);
  xml::Writer::BeginElement::~BeginElement(&local_38);
  local_10c = 0;
  while( true ) {
    iVar1 = local_10c;
    iVar2 = ri::List::getNumItems((List *)&(xmlWriter_local->m_dataBuf).m_dst);
    pWVar3 = local_18;
    if (iVar2 <= iVar1) break;
    item = ri::List::getItem((List *)&(xmlWriter_local->m_dataBuf).m_dst,local_10c);
    writeResultItem(item,local_18);
    local_10c = local_10c + 1;
  }
  xml::Writer::BeginElement::BeginElement(&local_130,"Result");
  pWVar3 = xml::Writer::operator<<(pWVar3,&local_130);
  pcVar4 = getTestStatusCodeName(*(TestStatusCode *)&(xmlWriter_local->m_dataBuf).field_0x1c);
  xml::Writer::Attribute::Attribute(&local_170,"StatusCode",pcVar4);
  pWVar3 = xml::Writer::operator<<(pWVar3,&local_170);
  pWVar3 = xml::Writer::operator<<
                     (pWVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &(xmlWriter_local->m_dataBuf).field_0x20);
  xml::Writer::operator<<(pWVar3,(EndElementType *)&xml::Writer::EndElement);
  xml::Writer::Attribute::~Attribute(&local_170);
  xml::Writer::BeginElement::~BeginElement(&local_130);
  xml::Writer::operator<<(local_18,(EndElementType *)&xml::Writer::EndElement);
  return;
}

Assistant:

void writeTestResult (const TestCaseResult& result, xe::xml::Writer& xmlWriter)
{
	using xml::Writer;

	xmlWriter << Writer::BeginElement("TestCaseResult")
			  << Writer::Attribute("Version", TEST_LOG_VERSION)
			  << Writer::Attribute("CasePath", result.casePath)
			  << Writer::Attribute("CaseType", getTestCaseTypeName(result.caseType));

	for (int ndx = 0; ndx < result.resultItems.getNumItems(); ndx++)
		writeResultItem(result.resultItems.getItem(ndx), xmlWriter);

	// Result item is not logged until end.
	xmlWriter << Writer::BeginElement("Result")
			  << Writer::Attribute("StatusCode", getTestStatusCodeName(result.statusCode))
			  << result.statusDetails
			  << Writer::EndElement;

	xmlWriter << Writer::EndElement;
}